

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_map.cpp
# Opt level: O0

void Omega_h::expand_into<double>
               (Read<signed_char> *a_data,LOs *a2b,Write<signed_char> *b_data,Int width)

{
  char *file;
  undefined1 local_1c0 [8];
  type f;
  __cxx11 local_180 [4];
  int na;
  allocator local_149;
  string local_148 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_128 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_108 [35];
  ScopedTimer local_e5;
  uint local_e4;
  ScopedTimer omega_h_scoped_function_timer;
  Write<signed_char> *pWStack_e0;
  Int width_local;
  Write<signed_char> *b_data_local;
  LOs *a2b_local;
  Read<signed_char> *a_data_local;
  ulong local_60;
  ulong local_50;
  ulong local_40;
  ulong local_30;
  ulong local_20;
  ulong local_10;
  
  local_e4 = width;
  pWStack_e0 = b_data;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_148,
             "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_map.cpp"
             ,&local_149);
  std::operator+(local_128,(char *)local_148);
  std::__cxx11::to_string(local_180,0x6a);
  std::operator+(local_108,local_128);
  file = (char *)std::__cxx11::string::c_str();
  ScopedTimer::ScopedTimer(&local_e5,"expand_into",file);
  std::__cxx11::string::~string((string *)local_108);
  std::__cxx11::string::~string((string *)local_180);
  std::__cxx11::string::~string((string *)local_128);
  std::__cxx11::string::~string(local_148);
  std::allocator<char>::~allocator((allocator<char> *)&local_149);
  if (((ulong)(a2b->write_).shared_alloc_.alloc & 1) == 0) {
    local_10 = ((a2b->write_).shared_alloc_.alloc)->size;
  }
  else {
    local_10 = (ulong)(a2b->write_).shared_alloc_.alloc >> 3;
  }
  f.a_data.write_.shared_alloc_.direct_ptr._4_4_ = (int)(local_10 >> 2) - 1;
  if (((ulong)(a_data->write_).shared_alloc_.alloc & 1) == 0) {
    local_20 = ((a_data->write_).shared_alloc_.alloc)->size;
  }
  else {
    local_20 = (ulong)(a_data->write_).shared_alloc_.alloc >> 3;
  }
  if ((int)(local_20 >> 3) != f.a_data.write_.shared_alloc_.direct_ptr._4_4_ * local_e4) {
    if (((ulong)(a_data->write_).shared_alloc_.alloc & 1) == 0) {
      local_30 = ((a_data->write_).shared_alloc_.alloc)->size;
    }
    else {
      local_30 = (ulong)(a_data->write_).shared_alloc_.alloc >> 3;
    }
    printf("This error can happen when an array has been subsetted - check sync_array usage vs sync_subset_array:\n a_data.size= %d na= %d width= %d"
           ,local_30 >> 3 & 0xffffffff,(ulong)f.a_data.write_.shared_alloc_.direct_ptr._4_4_,
           (ulong)local_e4);
  }
  if (((ulong)(a_data->write_).shared_alloc_.alloc & 1) == 0) {
    local_40 = ((a_data->write_).shared_alloc_.alloc)->size;
  }
  else {
    local_40 = (ulong)(a_data->write_).shared_alloc_.alloc >> 3;
  }
  if ((int)(local_40 >> 3) != f.a_data.write_.shared_alloc_.direct_ptr._4_4_ * local_e4) {
    if (((ulong)(a_data->write_).shared_alloc_.alloc & 1) == 0) {
      local_50 = ((a_data->write_).shared_alloc_.alloc)->size;
    }
    else {
      local_50 = (ulong)(a_data->write_).shared_alloc_.alloc >> 3;
    }
    printf("ERROR: a_data.size= %d na= %d width= %d\n",local_50 >> 3 & 0xffffffff,
           (ulong)f.a_data.write_.shared_alloc_.direct_ptr._4_4_,(ulong)local_e4);
  }
  if (((ulong)(a_data->write_).shared_alloc_.alloc & 1) == 0) {
    local_60 = ((a_data->write_).shared_alloc_.alloc)->size;
  }
  else {
    local_60 = (ulong)(a_data->write_).shared_alloc_.alloc >> 3;
  }
  if ((int)(local_60 >> 3) == f.a_data.write_.shared_alloc_.direct_ptr._4_4_ * local_e4) {
    Read<int>::Read((Read<int> *)local_1c0,a2b);
    f.a2b.write_.shared_alloc_.direct_ptr._0_4_ = local_e4;
    Write<double>::Write((Write<double> *)&f.width,(Write<double> *)b_data);
    Read<double>::Read((Read<double> *)&f.b_data.shared_alloc_.direct_ptr,(Read<double> *)a_data);
    parallel_for<Omega_h::expand_into<double>(Omega_h::Read<double>,Omega_h::Read<int>,Omega_h::Write<double>,int)::_lambda(int)_1_>
              (f.a_data.write_.shared_alloc_.direct_ptr._4_4_,(type *)local_1c0);
    expand_into<double>(Omega_h::Read<double>,Omega_h::Read<int>,Omega_h::Write<double>,int)::
    {lambda(int)#1}::~Write((_lambda_int__1_ *)local_1c0);
    ScopedTimer::~ScopedTimer(&local_e5);
    return;
  }
  fail("assertion %s failed at %s +%d\n","a_data.size() == na * width",
       "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_map.cpp"
       ,0x6e);
}

Assistant:

void expand_into(Read<T> a_data, LOs a2b, Write<T> b_data, Int width) {
  OMEGA_H_TIME_FUNCTION;
  auto na = a2b.size() - 1;
  if(a_data.size() != na * width) printf("This error can happen when an array has been subsetted - check sync_array usage vs sync_subset_array:\n"
                                         " a_data.size= %d na= %d width= %d", a_data.size(), na, width);
  OMEGA_H_CHECK_PRINTF(a_data.size() == na * width, "a_data.size= %d na= %d width= %d", a_data.size(), na, width);
  auto f = OMEGA_H_LAMBDA(LO a) {
    for (auto b = a2b[a]; b < a2b[a + 1]; ++b) {
      for (Int j = 0; j < width; ++j) {
        b_data[b * width + j] = a_data[a * width + j];
      }
    }
  };
  parallel_for(na, std::move(f));
}